

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

bool wallet::coinselector_tests::EqualResult(SelectionResult *a,SelectionResult *b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar4;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long in_FS_OFFSET;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar4 = SelectionResult::GetInputSet(a);
  p_Var6 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  psVar4 = SelectionResult::GetInputSet(a);
  psVar5 = SelectionResult::GetInputSet(b);
  p_Var7 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var6 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header) {
    lVar2 = *(long *)(p_Var6 + 1);
    lVar3 = *(long *)(p_Var7 + 1);
    auVar10[0] = -(*(char *)(lVar3 + 0x20) == *(char *)(lVar2 + 0x20));
    auVar10[1] = -(*(char *)(lVar3 + 0x21) == *(char *)(lVar2 + 0x21));
    auVar10[2] = -(*(char *)(lVar3 + 0x22) == *(char *)(lVar2 + 0x22));
    auVar10[3] = -(*(char *)(lVar3 + 0x23) == *(char *)(lVar2 + 0x23));
    auVar10[4] = -(*(char *)(lVar3 + 0x24) == *(char *)(lVar2 + 0x24));
    auVar10[5] = -(*(char *)(lVar3 + 0x25) == *(char *)(lVar2 + 0x25));
    auVar10[6] = -(*(char *)(lVar3 + 0x26) == *(char *)(lVar2 + 0x26));
    auVar10[7] = -(*(char *)(lVar3 + 0x27) == *(char *)(lVar2 + 0x27));
    auVar10[8] = -(*(char *)(lVar3 + 0x28) == *(char *)(lVar2 + 0x28));
    auVar10[9] = -(*(char *)(lVar3 + 0x29) == *(char *)(lVar2 + 0x29));
    auVar10[10] = -(*(char *)(lVar3 + 0x2a) == *(char *)(lVar2 + 0x2a));
    auVar10[0xb] = -(*(char *)(lVar3 + 0x2b) == *(char *)(lVar2 + 0x2b));
    auVar10[0xc] = -(*(char *)(lVar3 + 0x2c) == *(char *)(lVar2 + 0x2c));
    auVar10[0xd] = -(*(char *)(lVar3 + 0x2d) == *(char *)(lVar2 + 0x2d));
    auVar10[0xe] = -(*(char *)(lVar3 + 0x2e) == *(char *)(lVar2 + 0x2e));
    auVar10[0xf] = -(*(char *)(lVar3 + 0x2f) == *(char *)(lVar2 + 0x2f));
    auVar9[0] = -(*(char *)(lVar3 + 0x30) == *(char *)(lVar2 + 0x30));
    auVar9[1] = -(*(char *)(lVar3 + 0x31) == *(char *)(lVar2 + 0x31));
    auVar9[2] = -(*(char *)(lVar3 + 0x32) == *(char *)(lVar2 + 0x32));
    auVar9[3] = -(*(char *)(lVar3 + 0x33) == *(char *)(lVar2 + 0x33));
    auVar9[4] = -(*(char *)(lVar3 + 0x34) == *(char *)(lVar2 + 0x34));
    auVar9[5] = -(*(char *)(lVar3 + 0x35) == *(char *)(lVar2 + 0x35));
    auVar9[6] = -(*(char *)(lVar3 + 0x36) == *(char *)(lVar2 + 0x36));
    auVar9[7] = -(*(char *)(lVar3 + 0x37) == *(char *)(lVar2 + 0x37));
    auVar9[8] = -(*(char *)(lVar3 + 0x38) == *(char *)(lVar2 + 0x38));
    auVar9[9] = -(*(char *)(lVar3 + 0x39) == *(char *)(lVar2 + 0x39));
    auVar9[10] = -(*(char *)(lVar3 + 0x3a) == *(char *)(lVar2 + 0x3a));
    auVar9[0xb] = -(*(char *)(lVar3 + 0x3b) == *(char *)(lVar2 + 0x3b));
    auVar9[0xc] = -(*(char *)(lVar3 + 0x3c) == *(char *)(lVar2 + 0x3c));
    auVar9[0xd] = -(*(char *)(lVar3 + 0x3d) == *(char *)(lVar2 + 0x3d));
    auVar9[0xe] = -(*(char *)(lVar3 + 0x3e) == *(char *)(lVar2 + 0x3e));
    auVar9[0xf] = -(*(char *)(lVar3 + 0x3f) == *(char *)(lVar2 + 0x3f));
    auVar9 = auVar9 & auVar10;
    if (((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) ||
       (*(int *)(lVar2 + 0x40) != *(int *)(lVar3 + 0x40))) break;
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  }
  psVar4 = SelectionResult::GetInputSet(a);
  if ((_Rb_tree_header *)p_Var6 == &(psVar4->_M_t)._M_impl.super__Rb_tree_header) {
    psVar4 = SelectionResult::GetInputSet(b);
    bVar8 = (_Rb_tree_header *)p_Var7 == &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

static bool EqualResult(const SelectionResult& a, const SelectionResult& b)
{
    std::pair<CoinSet::iterator, CoinSet::iterator> ret = std::mismatch(a.GetInputSet().begin(), a.GetInputSet().end(), b.GetInputSet().begin(),
        [](const std::shared_ptr<COutput>& a, const std::shared_ptr<COutput>& b) {
            return a->outpoint == b->outpoint;
        });
    return ret.first == a.GetInputSet().end() && ret.second == b.GetInputSet().end();
}